

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O1

bool slang::ast::anon_unknown_0::PortConnectionBuilder::areDimSizesEqual
               (span<const_slang::ConstantRange,_18446744073709551615UL> left,
               span<const_slang::ConstantRange,_18446744073709551615UL> right)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  pointer pCVar7;
  __extent_storage<18446744073709551615UL> _Var8;
  pointer pCVar9;
  int iVar10;
  bool bVar11;
  
  _Var8 = left._M_extent._M_extent_value;
  pCVar9 = left._M_ptr;
  pCVar7 = right._M_ptr;
  if (_Var8._M_extent_value != right._M_extent._M_extent_value._M_extent_value) {
    return false;
  }
  bVar11 = _Var8._M_extent_value == 0;
  if (!bVar11) {
    iVar1 = pCVar7->left;
    iVar10 = pCVar7->right;
    iVar2 = pCVar9->left;
    iVar3 = iVar1 - iVar10;
    if (iVar1 - iVar10 == 0 || iVar1 < iVar10) {
      iVar3 = -(iVar1 - iVar10);
    }
    iVar1 = pCVar9->right;
    iVar10 = iVar2 - iVar1;
    if (iVar2 - iVar1 == 0 || iVar2 < iVar1) {
      iVar10 = -(iVar2 - iVar1);
    }
    if (iVar10 == iVar3) {
      uVar5 = 1;
      do {
        uVar6 = uVar5;
        if (_Var8._M_extent_value == uVar6) break;
        iVar1 = pCVar7[uVar6].left;
        iVar10 = pCVar7[uVar6].right;
        iVar2 = pCVar9[uVar6].left;
        iVar3 = pCVar9[uVar6].right;
        iVar4 = iVar1 - iVar10;
        if (iVar1 - iVar10 == 0 || iVar1 < iVar10) {
          iVar4 = -(iVar1 - iVar10);
        }
        iVar1 = iVar2 - iVar3;
        if (iVar2 - iVar3 == 0 || iVar2 < iVar3) {
          iVar1 = -(iVar2 - iVar3);
        }
        uVar5 = uVar6 + 1;
      } while (iVar1 == iVar4);
      bVar11 = _Var8._M_extent_value <= uVar6;
    }
  }
  return bVar11;
}

Assistant:

static bool areDimSizesEqual(std::span<const ConstantRange> left,
                                 std::span<const ConstantRange> right) {
        if (left.size() != right.size())
            return false;

        for (size_t i = 0; i < left.size(); i++) {
            if (left[i].width() != right[i].width())
                return false;
        }

        return true;
    }